

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H18_stack.c
# Opt level: O0

int main(void)

{
  int iVar1;
  double *d;
  int local_1c;
  int i;
  double *p;
  
  d = (double *)malloc(0x18);
  iVar1 = pop(d);
  if (iVar1 != -1) {
    __assert_fail("pop(p) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                  ,0x23,"int main()");
  }
  iVar1 = push(1.0);
  if (iVar1 != 1) {
    __assert_fail("push(1.0) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                  ,0x25,"int main()");
  }
  iVar1 = push(2.0);
  if (iVar1 != 2) {
    __assert_fail("push(2.0) == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                  ,0x26,"int main()");
  }
  iVar1 = push(3.0);
  if (iVar1 != 3) {
    __assert_fail("push(3.0) == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                  ,0x27,"int main()");
  }
  iVar1 = pop(d);
  if (iVar1 != 2) {
    __assert_fail("pop(p) == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                  ,0x29,"int main()");
  }
  iVar1 = pop(d + 1);
  if (iVar1 != 1) {
    __assert_fail("pop(p + 1) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                  ,0x2a,"int main()");
  }
  iVar1 = pop(d + 2);
  if (iVar1 != 0) {
    __assert_fail("pop(p + 2) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                  ,0x2b,"int main()");
  }
  if ((*d == 3.0) && (!NAN(*d))) {
    if ((d[1] != 2.0) || (NAN(d[1]))) {
      __assert_fail("*(p + 1) == 2.0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                    ,0x2e,"int main()");
    }
    if ((d[2] == 1.0) && (!NAN(d[2]))) {
      for (local_1c = 0; local_1c < 100; local_1c = local_1c + 1) {
        push((double)local_1c);
      }
      iVar1 = push(1.0);
      if (iVar1 == -1) {
        return 0;
      }
      __assert_fail("push(1.0) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                    ,0x35,"int main()");
    }
    __assert_fail("*(p + 2) == 1.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                  ,0x2f,"int main()");
  }
  __assert_fail("*p == 3.0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                ,0x2d,"int main()");
}

Assistant:

int main() {
  double *p = (double *)malloc(sizeof(double) * 3);

  assert(pop(p) == -1);

  assert(push(1.0) == 1);
  assert(push(2.0) == 2);
  assert(push(3.0) == 3);

  assert(pop(p) == 2);
  assert(pop(p + 1) == 1);
  assert(pop(p + 2) == 0);

  assert(*p == 3.0);
  assert(*(p + 1) == 2.0);
  assert(*(p + 2) == 1.0);

  for (int i = 0; i < STACKSIZE; i++) {
    push((double)i);
  }

  assert(push(1.0) == -1);
}